

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shop::addNewSale(Shop *this)

{
  ostream *poVar1;
  reference pvVar2;
  size_type sVar3;
  Sale local_2b0;
  undefined1 local_1d8 [8];
  Sale s;
  Medicine medicine;
  string local_60 [8];
  string date;
  string local_40 [8];
  string name;
  int local_1c;
  int local_18;
  int quantity;
  int ignore;
  int index;
  Shop *this_local;
  
  _ignore = this;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Select the index of Medicine which you want to sell:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printMedicines(this);
  std::istream::operator>>((istream *)&std::cin,&quantity);
  poVar1 = std::operator<<((ostream *)&std::cout,"Your selected Medicine is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printMedicine(this,quantity + -1);
  pvVar2 = std::vector<Medicine,_std::allocator<Medicine>_>::operator[]
                     (&this->medicineList,(long)(quantity + -1));
  Medicine::Medicine((Medicine *)&s.medicine.field_0x88,pvVar2);
  pvVar2 = std::vector<Medicine,_std::allocator<Medicine>_>::operator[]
                     (&this->medicineList,(long)(quantity + -1));
  Medicine::operator=(pvVar2,(Medicine *)&s.medicine.field_0x88);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Customer Name:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Date:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Quantity:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  sVar3 = std::vector<Sale,_std::allocator<Sale>_>::size(&this->salesList);
  Sale::Sale((Sale *)local_1d8,(int)sVar3 + 1,local_1c,(string *)local_60,(string *)local_40,
             (Medicine *)&s.medicine.field_0x88);
  poVar1 = std::operator<<((ostream *)&std::cout,"Your New Sell Summery is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Sale::Sale(&local_2b0,(Sale *)local_1d8);
  printSale(this,&local_2b0);
  Sale::~Sale(&local_2b0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Press any kew to Confirm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_18);
  std::vector<Sale,_std::allocator<Sale>_>::push_back(&this->salesList,(value_type *)local_1d8);
  Sale::~Sale((Sale *)local_1d8);
  Medicine::~Medicine((Medicine *)&s.medicine.field_0x88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void addNewSale() {
        int index, ignore;
        int quantity;
        string name, date;

        cout << "Select the index of Medicine which you want to sell:" << endl;
        printMedicines();
        cin >> index;
        cout << "Your selected Medicine is:" << endl;
        printMedicine(index - 1);

        Medicine medicine = medicineList[index - 1];
        medicine.isSold = true;
        medicine.quantity--;
        medicineList[index - 1] = medicine;

        cout << "Enter Customer Name:" << endl;
        cin >> name;
        cout << "Enter Date:" << endl;
        cin >> date;
        cout << "Enter Quantity:" << endl;
        cin >> quantity;
        Sale s = Sale(salesList.size() + 1, quantity, date, name, medicine);

        cout << "Your New Sell Summery is:" << endl;
        printSale(s);

        cout << "Press any kew to Confirm:" << endl;
        cin >> ignore;
        salesList.push_back(s);

    }